

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int experimental_hooks_prof_sample_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  prof_sample_hook_t in_RAX;
  int iVar2;
  size_t __n;
  prof_sample_hook_t old_hook;
  prof_sample_hook_t local_28;
  
  iVar2 = 0x16;
  if (oldp != (void *)0x0 || newp != (void *)0x0) {
    local_28 = in_RAX;
    if ((oldp != (void *)0x0) &&
       (local_28 = duckdb_je_prof_sample_hook_get(), oldlenp != (size_t *)0x0)) {
      uVar1 = *oldlenp;
      if (uVar1 != 8) {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        switchD_015df945::default(oldp,&local_28,__n);
        *oldlenp = __n;
        return 0x16;
      }
      *(prof_sample_hook_t *)oldp = local_28;
    }
    iVar2 = 0;
    if (((newp != (void *)0x0) && (iVar2 = 2, duckdb_je_opt_prof == true)) &&
       (iVar2 = 0x16, newlen == 8)) {
      duckdb_je_prof_sample_hook_set(*newp);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
experimental_hooks_prof_sample_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	if (oldp == NULL && newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	if (oldp != NULL) {
		prof_sample_hook_t old_hook =
		    prof_sample_hook_get();
		READ(old_hook, prof_sample_hook_t);
	}
	if (newp != NULL) {
		if (!opt_prof) {
			ret = ENOENT;
			goto label_return;
		}
		prof_sample_hook_t new_hook JEMALLOC_CC_SILENCE_INIT(NULL);
		WRITE(new_hook, prof_sample_hook_t);
		prof_sample_hook_set(new_hook);
	}
	ret = 0;
label_return:
	return ret;
}